

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

bool __thiscall ON_NurbsSurface::IsValid(ON_NurbsSurface *this,ON_TextLog *text_log)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  double *pdVar7;
  int local_54;
  int k;
  double *cv;
  int local_40;
  int j;
  int i_1;
  int cvdim;
  int b0;
  int b1;
  int a1;
  int a0;
  int i;
  bool rc;
  ON_TextLog *text_log_local;
  ON_NurbsSurface *this_local;
  
  this_local._7_1_ = false;
  if (this->m_dim < 1) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"ON_NurbsSurface.m_dim = %d (should be > 0).\n",
                        (ulong)(uint)this->m_dim);
    }
  }
  else if (this->m_cv == (double *)0x0) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"ON_NurbsSurface.m_cv is nullptr.\n",(ulong)(uint)this->m_dim);
    }
  }
  else {
    this_local._7_1_ = true;
    a1 = 0;
    while( true ) {
      bVar2 = false;
      if (a1 < 2) {
        bVar2 = this_local._7_1_;
      }
      if (bVar2 == false) break;
      this_local._7_1_ = false;
      if (this->m_order[a1] < 2) {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,"ON_NurbsSurface.m_order[i] = %d (should be >= 2).\n",
                            (ulong)(uint)a1,(ulong)(uint)this->m_order[a1]);
        }
      }
      else if (this->m_cv_count[a1] < this->m_order[a1]) {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,
                            "ON_NurbsSurface.m_cv_count[%d] = %d (should be >= m_order[%d]=%d).\n",
                            (ulong)(uint)a1,(ulong)(uint)this->m_cv_count[a1],(ulong)(uint)a1,
                            (ulong)(uint)this->m_order[a1]);
        }
      }
      else if (this->m_knot[a1] == (double *)0x0) {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,"ON_NurbsSurface.m_knot[i] is nullptr.\n");
        }
      }
      else {
        bVar2 = ON_IsValidKnotVector
                          (this->m_order[a1],this->m_cv_count[a1],this->m_knot[a1],text_log);
        if (bVar2) {
          iVar6 = this->m_cv_stride[a1];
          iVar4 = CVSize(this);
          if (iVar6 < iVar4) {
            if (text_log != (ON_TextLog *)0x0) {
              uVar1 = this->m_cv_stride[a1];
              uVar3 = CVSize(this);
              ON_TextLog::Print(text_log,
                                "ON_NurbsSurface.m_cv_stride[%d]=%d is too small (should be >= %d).\n"
                                ,(ulong)(uint)a1,(ulong)uVar1,(ulong)uVar3);
            }
          }
          else {
            this_local._7_1_ = true;
          }
        }
        else if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,"ON_NurbsSurface.m_knot[%d] is not a valid knot vector.\n",
                            (ulong)(uint)a1);
        }
      }
      a1 = a1 + 1;
    }
    if (this_local._7_1_ != false) {
      iVar4 = CVSize(this);
      iVar6 = this->m_cv_count[0];
      iVar5 = CVSize(this);
      if (((this->m_cv_stride[0] < iVar4) || (this->m_cv_stride[1] < iVar6 * iVar4)) &&
         ((this->m_cv_stride[0] < this->m_cv_count[1] * iVar5 || (this->m_cv_stride[1] < iVar5)))) {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,"ON_NurbsSurface.m_cv_stride[] = {%d,%d} is not valid.\n",
                            (ulong)(uint)this->m_cv_stride[0],(ulong)(uint)this->m_cv_stride[1]);
        }
        this_local._7_1_ = false;
      }
    }
    if (this_local._7_1_ != false) {
      iVar6 = CVSize(this);
      for (local_40 = 0; local_40 < this->m_cv_count[0]; local_40 = local_40 + 1) {
        for (cv._4_4_ = 0; cv._4_4_ < this->m_cv_count[1]; cv._4_4_ = cv._4_4_ + 1) {
          pdVar7 = CV(this,local_40,cv._4_4_);
          for (local_54 = 0; local_54 < iVar6; local_54 = local_54 + 1) {
            bVar2 = false;
            if (-1e+307 < pdVar7[local_54]) {
              bVar2 = pdVar7[local_54] <= 1e+307 && pdVar7[local_54] != 1e+307;
            }
            if (!bVar2) {
              return false;
            }
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_NurbsSurface::IsValid( ON_TextLog* text_log ) const
{
  bool rc = false;

  if ( m_dim <= 0 )
  {
    if ( text_log )
    {
      text_log->Print("ON_NurbsSurface.m_dim = %d (should be > 0).\n",m_dim);
    }
  }
  else if ( m_cv == nullptr )
  {
    if ( text_log )
    {
      text_log->Print("ON_NurbsSurface.m_cv is nullptr.\n",m_dim);
    }
  }
  else
  {
    rc = true;
    for ( int i = 0; i < 2 && rc; i++ )
    {
      rc = false;
      if (m_order[i] < 2 )
      {
        if ( text_log )
        {
          text_log->Print("ON_NurbsSurface.m_order[i] = %d (should be >= 2).\n",i,m_order[i]);
        }
      }
      else if (m_cv_count[i] < m_order[i] )
      {
        if ( text_log )
        {
          text_log->Print("ON_NurbsSurface.m_cv_count[%d] = %d (should be >= m_order[%d]=%d).\n",i,m_cv_count[i],i,m_order[i]);
        }
      }
      else if (m_knot[i] == nullptr)
      {
        if ( text_log )
        {
          text_log->Print("ON_NurbsSurface.m_knot[i] is nullptr.\n");
        }
      }
      else if ( !ON_IsValidKnotVector( m_order[i], m_cv_count[i], m_knot[i], text_log ) )
      {
        if ( text_log )
        {
          text_log->Print("ON_NurbsSurface.m_knot[%d] is not a valid knot vector.\n",i);
        }
      }
      else if ( m_cv_stride[i] < CVSize() )
      {
        if ( text_log )
        {
          text_log->Print("ON_NurbsSurface.m_cv_stride[%d]=%d is too small (should be >= %d).\n",i,m_cv_stride[i],CVSize());
        }
      }
      else
        rc = true;
    }
    if ( rc )
    {
      int a0 = CVSize();
      int a1 = m_cv_count[0]*a0;
      int b1 = CVSize();
      int b0 = m_cv_count[1]*b1;
      if ( m_cv_stride[0] < a0 || m_cv_stride[1] < a1 )
      {
        if ( m_cv_stride[0] < b0 || m_cv_stride[1] < b1 )
        {
          if ( text_log )
          {
            text_log->Print("ON_NurbsSurface.m_cv_stride[] = {%d,%d} is not valid.\n",m_cv_stride[0],m_cv_stride[1]);
          }
          rc = false;
        }
      }
    }

    if (rc)
    {
      const int cvdim = CVSize();
      for (int i = 0; m_cv_count[0] > i; ++i)
      {
        for (int j = 0; m_cv_count[1] > j; ++j)
        {
          const double* cv = CV(i, j);
          for (int k = 0; cvdim > k; ++k)
          {
            if (false == ON_CV_COORDINATE_IS_VALID(cv[k]))
              return false;
          }
        }
      }
    }
  }

  return rc;
}